

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCInst.c
# Opt level: O0

void MCInst_insert0(MCInst *inst,int index,MCOperand *Op)

{
  uchar uVar1;
  undefined3 uVar2;
  MCOperand *pMVar3;
  MCOperand *pMVar4;
  int i;
  MCOperand *Op_local;
  int index_local;
  MCInst *inst_local;
  
  for (i = (int)inst->size; index < i; i = i + -1) {
    pMVar3 = inst->Operands + i;
    pMVar4 = inst->Operands + (i + -1);
    uVar1 = pMVar4->Kind;
    uVar2 = *(undefined3 *)&pMVar4->field_0x5;
    pMVar3->MachineOperandType = pMVar4->MachineOperandType;
    pMVar3->Kind = uVar1;
    *(undefined3 *)&pMVar3->field_0x5 = uVar2;
    pMVar3->field_2 = pMVar4->field_2;
  }
  pMVar3 = inst->Operands + index;
  uVar1 = Op->Kind;
  uVar2 = *(undefined3 *)&Op->field_0x5;
  pMVar3->MachineOperandType = Op->MachineOperandType;
  pMVar3->Kind = uVar1;
  *(undefined3 *)&pMVar3->field_0x5 = uVar2;
  pMVar3->field_2 = Op->field_2;
  inst->size = inst->size + '\x01';
  return;
}

Assistant:

void MCInst_insert0(MCInst *inst, int index, MCOperand *Op)
{
	int i;

	for(i = inst->size; i > index; i--)
		//memcpy(&(inst->Operands[i]), &(inst->Operands[i-1]), sizeof(MCOperand));
		inst->Operands[i] = inst->Operands[i-1];

	inst->Operands[index] = *Op;
	inst->size++;
}